

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCore.c
# Opt level: O3

void Cec_ManSimulation(Gia_Man_t *pAig,Cec_ParSim_t *pPars)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  char *format;
  int level;
  Gia_Man_t *pGVar5;
  int iVar6;
  
  iVar1 = 1;
  Gia_ManRandom(1);
  if (pPars->fSeqSimulate != 0) {
    Abc_Print(iVar1,"Performing rounds of random simulation of %d frames with %d words.\n",
              (ulong)(uint)pPars->nRounds,(ulong)(uint)pPars->nFrames,(ulong)(uint)pPars->nWords);
  }
  pGVar5 = pAig;
  iVar1 = Gia_ManEquivCountLits(pAig);
  level = (int)pGVar5;
  uVar3 = (ulong)(uint)pPars->nRounds;
  if (pPars->nRounds < 1) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    iVar6 = 0;
    do {
      pGVar5 = pAig;
      iVar2 = Cec_ManSimulationOne(pAig,pPars);
      level = (int)pGVar5;
      if (iVar2 != 0) {
        uVar3 = (ulong)uVar4;
        goto LAB_0064df22;
      }
      pGVar5 = pAig;
      iVar2 = Gia_ManEquivCountLits(pAig);
      level = (int)pGVar5;
      if (iVar2 < iVar1 || iVar1 == 0) {
        iVar6 = 0;
        iVar1 = iVar2;
      }
      else {
        iVar6 = iVar6 + 1;
        if (iVar6 == pPars->nNonRefines) {
          uVar4 = uVar4 + 1;
          uVar3 = (ulong)(uint)pPars->nRounds;
          break;
        }
        if (iVar1 != iVar2) {
          __assert_fail("nLitsOld == nLitsNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecCore.c"
                        ,0x13a,"void Cec_ManSimulation(Gia_Man_t *, Cec_ParSim_t *)");
        }
      }
      uVar4 = uVar4 + 1;
      uVar3 = (ulong)(uint)pPars->nRounds;
    } while ((int)uVar4 < pPars->nRounds);
  }
  if (uVar4 == (uint)uVar3) {
LAB_0064df22:
    format = "Random simulation is stopped after %d rounds.\n";
  }
  else {
    format = "Random simulation saturated after %d rounds.\n";
    uVar3 = (ulong)uVar4;
  }
  Abc_Print(level,format,uVar3);
  if ((pPars->fCheckMiter != 0) && (uVar4 = Cec_ManCountNonConstOutputs(pAig), uVar4 != 0)) {
    Abc_Print((int)pAig,"The number of POs that are not const-0 candidates = %d.\n",(ulong)uVar4);
    return;
  }
  return;
}

Assistant:

void Cec_ManSimulation( Gia_Man_t * pAig, Cec_ParSim_t * pPars )
{
    int r, nLitsOld, nLitsNew, nCountNoRef = 0, fStop = 0;
    Gia_ManRandom( 1 );
    if ( pPars->fSeqSimulate )
        Abc_Print( 1, "Performing rounds of random simulation of %d frames with %d words.\n", 
            pPars->nRounds, pPars->nFrames, pPars->nWords );
    nLitsOld = Gia_ManEquivCountLits( pAig );
    for ( r = 0; r < pPars->nRounds; r++ )
    {
        if ( Cec_ManSimulationOne( pAig, pPars ) )
        {
            fStop = 1;
            break;
        }
        // decide when to stop
        nLitsNew = Gia_ManEquivCountLits( pAig );
        if ( nLitsOld == 0 || nLitsOld > nLitsNew )
        {
            nLitsOld = nLitsNew;
            nCountNoRef = 0;
        }
        else if ( ++nCountNoRef == pPars->nNonRefines )
        {
            r++;
            break;
        }
        assert( nLitsOld == nLitsNew );
    }
//    if ( pPars->fVerbose )
    if ( r == pPars->nRounds || fStop )
        Abc_Print( 1, "Random simulation is stopped after %d rounds.\n", r );
    else
        Abc_Print( 1, "Random simulation saturated after %d rounds.\n", r );
    if ( pPars->fCheckMiter )
    {
        int nNonConsts = Cec_ManCountNonConstOutputs( pAig );
        if ( nNonConsts )
            Abc_Print( 1, "The number of POs that are not const-0 candidates = %d.\n", nNonConsts );
    }
}